

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O3

Vec_Int_t * Llb_DriverCollectNs(Aig_Man_t *pAig,Vec_Int_t *vDriRefs)

{
  void *pvVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = pAig->nRegs;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar3;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar5;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      piVar3 = (int *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
      iVar4 = piVar3[9];
      if (((long)iVar4 < 0) || (vDriRefs->nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (((vDriRefs->pArray[iVar4] != 1) ||
          (uVar2 = (uint)*(undefined8 *)(piVar3 + 6) & 7, uVar2 == 1)) ||
         ((uVar2 == 2 && (*piVar3 < pAig->nTruePis)))) {
        iVar4 = *(int *)((long)pvVar1 + 0x24);
      }
      Vec_IntPush(p,iVar4);
      iVar5 = iVar5 + 1;
    } while (iVar5 < pAig->nRegs);
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_DriverCollectNs( Aig_Man_t * pAig, Vec_Int_t * vDriRefs )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj, * pDri;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pDri = Aig_ObjFanin0(pObj);
        if ( Vec_IntEntry( vDriRefs, Aig_ObjId(pDri) ) != 1 || Saig_ObjIsPi(pAig, pDri) || Aig_ObjIsConst1(pDri) )
            Vec_IntPush( vVars, Aig_ObjId(pObj) );
        else
            Vec_IntPush( vVars, Aig_ObjId(pDri) );
    }
    return vVars;
}